

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createCooperativeMatrixLengthNV(Builder *this,Id type)

{
  Id IVar1;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_68;
  pointer local_60;
  Instruction *length;
  allocator<unsigned_int> local_39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  Id local_20;
  Id local_1c;
  Id intType;
  Id type_local;
  Builder *this_local;
  
  local_1c = type;
  _intType = this;
  IVar1 = makeUintType(this,0x20);
  local_20 = IVar1;
  if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
    this_00 = (Instruction *)::operator_new(0x60);
    IVar1 = getUniqueId(this);
    spv::Instruction::Instruction(this_00,IVar1,local_20,OpCooperativeMatrixLengthNV);
    local_60 = this_00;
    spv::Instruction::addIdOperand(this_00,local_1c);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_68,
               local_60);
    addInstruction(this,&local_68);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_68);
    this_local._4_4_ = spv::Instruction::getResultId(local_60);
  }
  else {
    std::allocator<unsigned_int>::allocator(&local_39);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_38,1,&local_1c,&local_39);
    memset(&length,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&length);
    this_local._4_4_ =
         createSpecConstantOp
                   (this,OpCooperativeMatrixLengthNV,IVar1,&local_38,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&length);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&length);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
    std::allocator<unsigned_int>::~allocator(&local_39);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createCooperativeMatrixLengthNV(Id type)
{
    spv::Id intType = makeUintType(32);

    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        return createSpecConstantOp(OpCooperativeMatrixLengthNV, intType, std::vector<Id>(1, type), std::vector<Id>());
    }

    Instruction* length = new Instruction(getUniqueId(), intType, OpCooperativeMatrixLengthNV);
    length->addIdOperand(type);
    addInstruction(std::unique_ptr<Instruction>(length));

    return length->getResultId();
}